

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O1

curi_status
curi_url_decode(char *input,size_t inputLen,char *output,size_t outputCapacity,size_t *outputLen)

{
  char cVar1;
  ushort *puVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  curi_status cVar7;
  size_t __TRY_initialOffset;
  ushort **ppuVar8;
  __int32_t **pp_Var9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  size_t __TRY_initialOffset_1;
  ulong uVar14;
  
  if (outputCapacity == 0) {
    uVar10 = 0;
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    uVar10 = 0;
    do {
      pcVar12 = input + uVar10;
      if (inputLen <= uVar10) {
        pcVar12 = "";
      }
      uVar14 = uVar10 + 1;
      bVar4 = true;
      if (*pcVar12 == '%') {
        pcVar12 = input + uVar14;
        if (inputLen <= uVar14) {
          pcVar12 = "";
        }
        uVar14 = uVar10 + 2;
        if ((0x36 < (byte)*pcVar12 - 0x30) ||
           ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar12 - 0x30) & 0x3f) & 1) == 0))
        goto LAB_0010245f;
        pcVar12 = input + uVar14;
        if (inputLen <= uVar14) {
          pcVar12 = "";
        }
        uVar14 = uVar10 + 3;
        if ((0x36 < (byte)*pcVar12 - 0x30) ||
           (bVar3 = false, (0x7e0000007e03ffU >> ((ulong)((byte)*pcVar12 - 0x30) & 0x3f) & 1) == 0))
        goto LAB_0010245f;
        bVar4 = false;
      }
      else {
LAB_0010245f:
        bVar3 = true;
      }
      if (bVar4) {
        bVar3 = true;
        uVar14 = uVar10;
      }
      uVar10 = uVar14;
      if (!bVar3) {
        ppuVar8 = __ctype_b_loc();
        puVar2 = *ppuVar8;
        cVar1 = input[uVar10 - 2];
        if ((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 8) == 0) {
          pp_Var9 = __ctype_tolower_loc();
          iVar13 = (*pp_Var9)[cVar1] + -0x57;
        }
        else {
          iVar13 = cVar1 + -0x30;
        }
        pp_Var9 = __ctype_tolower_loc();
        iVar5 = (*pp_Var9)[input[uVar10 - 1]];
        if ((*(byte *)((long)puVar2 + (long)iVar5 * 2 + 1) & 8) == 0) {
          iVar5 = tolower(iVar5);
          uVar6 = iVar5 - 0x57;
        }
        else {
          uVar6 = iVar5 - 0x30;
        }
        uVar6 = iVar13 << 4 | uVar6;
        bVar3 = true;
        if ((int)uVar6 < 0x80) {
          output[uVar11] = (char)uVar6;
          uVar11 = uVar11 + 1;
          bVar3 = false;
        }
      }
      if (bVar3) {
        pcVar12 = input + uVar10;
        if (inputLen <= uVar10) {
          pcVar12 = "";
        }
        cVar1 = *pcVar12;
        bVar3 = cVar1 != '+';
        uVar10 = (cVar1 == '+') + uVar10;
        if (cVar1 == '+') {
          output[uVar11] = ' ';
          uVar11 = uVar11 + 1;
          bVar3 = false;
        }
      }
      if (bVar3) {
        pcVar12 = input + uVar10;
        if (inputLen <= uVar10) {
          pcVar12 = "";
        }
        cVar1 = *pcVar12;
        output[uVar11] = cVar1;
        if (cVar1 == '\0') goto LAB_00102591;
        uVar10 = uVar10 + 1;
        uVar11 = uVar11 + 1;
      }
    } while (uVar11 < outputCapacity);
  }
  pcVar12 = "";
  if (uVar10 < inputLen) {
    pcVar12 = input + uVar10;
  }
  cVar7 = curi_status_error;
  if (*pcVar12 == '\0') {
LAB_00102591:
    if (outputLen != (size_t *)0x0) {
      *outputLen = uVar11;
    }
    cVar7 = curi_status_success;
  }
  return cVar7;
}

Assistant:

curi_status curi_url_decode(const char* input, size_t inputLen, char* output, size_t outputCapacity, size_t* outputLen /*=0*/)
{
    curi_status status = curi_status_error;
    size_t inputOffset = 0;
    size_t outputOffset = 0;

    #define HEXTOI(x) (isdigit(x) ? x - '0' : tolower(x) - 'a' + 10)

    while ( outputOffset < outputCapacity )
    {
        status = curi_status_error;
        if (status == curi_status_error)
        {
            // percent encoding
            TRY(status, &inputOffset, parse_percent_encoded(input, inputLen, &inputOffset, 0, 0));

            if (status == curi_status_success)
            {
                int encodedChar = ((HEXTOI(input[inputOffset - 2]) << 4) | HEXTOI(tolower(input[inputOffset - 1])));
                if (encodedChar < 128) // Only support ascii percent encodage at the moment.
                {
                    output[outputOffset] = (char)encodedChar;
                    ++outputOffset;
                }
                else
                {
                    status = curi_status_error;
                }
            }
        }

        if (status == curi_status_error)
        {
            // '+' as a space
            TRY(status, &inputOffset, parse_char('+', input, inputLen, &inputOffset, 0, 0));
            if (status == curi_status_success)
            {
                 output[outputOffset] = ' ';
                 ++outputOffset;
            }
        }

        if (status == curi_status_error)
        {
            // "any" character
            output[outputOffset] = *read_char(input, inputLen, &inputOffset);
            if (output[outputOffset] == '\0')
            {
                if (outputLen)
                    *outputLen = outputOffset;

                return curi_status_success;
            }
            else
            {
                ++outputOffset;
            }
        }
    }

    if (*read_char(input, inputLen, &inputOffset) == '\0')
    {
        if (outputLen)
            *outputLen = outputOffset;

        return curi_status_success;
    }
    else
    {
        return curi_status_error;
    }
}